

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O0

TPZFMatrix<double> *
pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::TensorProd<double>
          (TPZFMatrix<double> *vec1,TPZFMatrix<double> *vec2)

{
  double *pdVar1;
  TPZFMatrix<double> *in_RDI;
  double dVar2;
  int j;
  int i;
  TPZFNMatrix<9,_double> res;
  _func_int **in_stack_fffffffffffffec0;
  TPZFMatrix<double> *in_stack_fffffffffffffec8;
  TPZFMatrix<double> *in_stack_fffffffffffffed0;
  int64_t in_stack_fffffffffffffee8;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffef0;
  int local_108;
  int local_104;
  
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(int64_t)in_RDI,(double *)in_RDI);
  for (local_104 = 0; local_104 < 3; local_104 = local_104 + 1) {
    for (local_108 = 0; local_108 < 3; local_108 = local_108 + 1) {
      in_stack_fffffffffffffed0 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffed0,(int64_t)in_stack_fffffffffffffec8,
                      (int64_t)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec0 =
           (in_stack_fffffffffffffed0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable
           ._vptr_TPZSavable;
      in_stack_fffffffffffffec8 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffed0,(int64_t)in_stack_fffffffffffffec8,
                      (int64_t)in_stack_fffffffffffffec0);
      dVar2 = (double)in_stack_fffffffffffffec0 *
              (double)(in_stack_fffffffffffffec8->super_TPZMatrix<double>).super_TPZBaseMatrix.
                      super_TPZSavable._vptr_TPZSavable;
      pdVar1 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffed0,(int64_t)in_stack_fffffffffffffec8,
                          (int64_t)in_stack_fffffffffffffec0);
      *pdVar1 = dVar2;
    }
  }
  TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x17c8dc5);
  return in_RDI;
}

Assistant:

static TPZFMatrix<T> TensorProd(TPZFMatrix<T> &vec1, TPZFMatrix<T> &vec2)
        {
            TPZFNMatrix<9,T> res(3,3,0.);
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < 3; j++) {
                    res(i,j) = vec1(i,0) * vec2(j,0);
                }
            }
            return res;
        }